

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_1::copyCompressionRecord(Header *dst,Header *src)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  pthread_mutex_t *__mutex;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  iterator __position;
  _Base_ptr p_Var7;
  Header *local_30;
  
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex == (pthread_mutex_t *)0x0) {
    return;
  }
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  p_Var1 = (_Base_ptr)((long)__mutex + 0x30);
  p_Var2 = *(_Base_ptr *)((long)__mutex + 0x38);
  p_Var6 = p_Var1;
  for (p_Var3 = p_Var2; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(Header **)(p_Var3 + 1) < src]) {
    if (*(Header **)(p_Var3 + 1) >= src) {
      p_Var6 = p_Var3;
    }
  }
  p_Var7 = p_Var1;
  if ((p_Var6 != p_Var1) && (p_Var7 = p_Var6, src < *(Header **)(p_Var6 + 1))) {
    p_Var7 = p_Var1;
  }
  p_Var6 = p_Var1;
  if (p_Var7 == p_Var1) {
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(Header **)(p_Var2 + 1) < dst]) {
      if (*(Header **)(p_Var2 + 1) >= dst) {
        p_Var6 = p_Var2;
      }
    }
    __position._M_node = p_Var1;
    if ((p_Var6 != p_Var1) && (__position._M_node = p_Var6, dst < *(Header **)(p_Var6 + 1))) {
      __position._M_node = p_Var1;
    }
    if (__position._M_node != p_Var1) {
      std::
      map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
      ::erase_abi_cxx11_((map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
                          *)&__mutex[1].__data,__position);
    }
  }
  else {
    local_30 = dst;
    pmVar5 = std::
             map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
             ::operator[]((map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
                           *)&__mutex[1].__data,&local_30);
    *pmVar5 = (mapped_type)p_Var7[1]._M_parent;
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

static void
copyCompressionRecord (Header* dst, const Header* src)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (src);
        if (i != s->_store.end ()) { s->_store[dst] = i->second; }
        else
        {
            i = s->_store.find (dst);
            if (i != s->_store.end ()) s->_store.erase (i);
        }
    }
}